

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparseNode * __thiscall
BVSparse<Memory::ArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::ArenaAllocator> *this,BVIndex i,Type_conflict **prevNextFieldOut,
          bool create)

{
  BVSparse<Memory::ArenaAllocator> *pBVar1;
  Type pBVar2;
  BVSparse<Memory::ArenaAllocator> *pBVar3;
  BVSparse<Memory::ArenaAllocator> *pBVar4;
  uint uVar5;
  
  uVar5 = i & 0xffffffc0;
  pBVar4 = (BVSparse<Memory::ArenaAllocator> *)this->lastUsedNodePrevNextField;
  pBVar1 = (BVSparse<Memory::ArenaAllocator> *)pBVar4->head;
  if (pBVar1 != (BVSparse<Memory::ArenaAllocator> *)0x0) {
    if (*(uint *)&pBVar1->lastFoundIndex == uVar5) {
      *prevNextFieldOut = (Type_conflict *)pBVar4;
      return (BVSparseNode *)pBVar1;
    }
    if (*(uint *)&pBVar1->lastFoundIndex <= uVar5) goto LAB_00786d3b;
  }
  pBVar1 = (BVSparse<Memory::ArenaAllocator> *)this->head;
  pBVar4 = this;
LAB_00786d3b:
  do {
    pBVar3 = pBVar1;
    if (pBVar3 == (BVSparse<Memory::ArenaAllocator> *)0x0) {
LAB_00786d55:
      if (create) {
        pBVar2 = pBVar4->head;
        pBVar3 = (BVSparse<Memory::ArenaAllocator> *)
                 new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
        pBVar3->head = pBVar2;
        *(uint *)&pBVar3->lastFoundIndex = uVar5;
        ((Type *)&pBVar3->alloc)->word = 0;
        pBVar4->head = (Type)pBVar3;
LAB_00786d87:
        *prevNextFieldOut = &pBVar4->head;
        this->lastUsedNodePrevNextField = &pBVar4->head;
      }
      else {
        pBVar3 = (BVSparse<Memory::ArenaAllocator> *)0x0;
      }
      return (BVSparseNode *)pBVar3;
    }
    if (uVar5 <= *(uint *)&pBVar3->lastFoundIndex) {
      if (uVar5 == *(uint *)&pBVar3->lastFoundIndex) goto LAB_00786d87;
      goto LAB_00786d55;
    }
    pBVar1 = (BVSparse<Memory::ArenaAllocator> *)pBVar3->head;
    pBVar4 = pBVar3;
  } while( true );
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}